

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_annotations.cc
# Opt level: O0

int RunningOnValgrind(void)

{
  undefined4 local_c;
  int local_running_on_valgrind;
  
  local_c = RunningOnValgrind::running_on_valgrind;
  if (RunningOnValgrind::running_on_valgrind == -1) {
    local_c = GetRunningOnValgrind();
  }
  RunningOnValgrind::running_on_valgrind = local_c;
  return local_c;
}

Assistant:

int RunningOnValgrind(void) {
  static volatile int running_on_valgrind = -1;
  int local_running_on_valgrind = running_on_valgrind;
  /* C doesn't have thread-safe initialization of statics, and we
     don't want to depend on pthread_once here, so hack it. */
  ANNOTATE_BENIGN_RACE(&running_on_valgrind, "safe hack");
  if (local_running_on_valgrind == -1)
    running_on_valgrind = local_running_on_valgrind = GetRunningOnValgrind();
  return local_running_on_valgrind;
}